

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

_Bool bitsets_intersect(bitset_t *b1,bitset_t *b2)

{
  ulong local_30;
  size_t k;
  size_t minlength;
  bitset_t *b2_local;
  bitset_t *b1_local;
  
  if (b1->arraysize < b2->arraysize) {
    local_30 = b1->arraysize;
  }
  else {
    local_30 = b2->arraysize;
  }
  k = 0;
  while( true ) {
    if (local_30 <= k) {
      return false;
    }
    if ((b1->array[k] & b2->array[k]) != 0) break;
    k = k + 1;
  }
  return true;
}

Assistant:

bool bitsets_intersect(const bitset_t *CBITSET_RESTRICT b1,
                       const bitset_t *CBITSET_RESTRICT b2) {
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;

    for (size_t k = 0; k < minlength; k++) {
        if ((b1->array[k] & b2->array[k]) != 0) return true;
    }
    return false;
}